

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O0

void cf2_doFlex(CF2_Stack opStack,CF2_F16Dot16 *curX,CF2_F16Dot16 *curY,CF2_GlyphPath glyphPath,
               FT_Bool *readFromStack,FT_Bool doConditionalLastRead)

{
  FT_Bool FVar1;
  int iVar2;
  int iVar3;
  CF2_F16Dot16 CVar4;
  CF2_F16Dot16 CVar5;
  int local_a4;
  int local_9c;
  CF2_F16Dot16 lastVal;
  int iStack_88;
  FT_Bool lastIsX;
  FT_Fast j;
  FT_Fast i;
  FT_Fast top;
  FT_Bool isHFlex;
  FT_UFast idx;
  CF2_F16Dot16 vals [14];
  FT_Bool doConditionalLastRead_local;
  FT_Bool *readFromStack_local;
  CF2_GlyphPath glyphPath_local;
  CF2_F16Dot16 *curY_local;
  CF2_F16Dot16 *curX_local;
  CF2_Stack opStack_local;
  
  top = 0;
  FVar1 = readFromStack[9];
  iVar3 = 10;
  if (FVar1 == '\0') {
    iVar3 = 9;
  }
  for (iStack_88 = 0; iStack_88 < iVar3; iStack_88 = iStack_88 + 1) {
    vals[(long)(iStack_88 + 2) + -2] = vals[(long)iStack_88 + -2];
    if (readFromStack[iStack_88] != '\0') {
      iVar2 = vals[(long)(iStack_88 + 2) + -2];
      CVar4 = cf2_stack_getReal(opStack,top);
      vals[(long)(iStack_88 + 2) + -2] = iVar2 + CVar4;
      top = top + 1;
    }
  }
  if (FVar1 == '\0') {
    vals[9] = *curY;
  }
  if (doConditionalLastRead == '\0') {
    if (readFromStack[10] == '\0') {
      vals[10] = *curX;
    }
    else {
      CVar4 = cf2_stack_getReal(opStack,top);
      vals[10] = vals[8] + CVar4;
      top = top + 1;
    }
    CVar4 = vals[9];
    if (readFromStack[0xb] == '\0') {
      vals[0xb] = *curY;
    }
    else {
      CVar5 = cf2_stack_getReal(opStack,top);
      vals[0xb] = CVar4 + CVar5;
    }
  }
  else {
    if (vals[8] - *curX < 0) {
      local_9c = -(vals[8] - *curX);
    }
    else {
      local_9c = vals[8] - *curX;
    }
    if (vals[9] - *curY < 0) {
      local_a4 = -(vals[9] - *curY);
    }
    else {
      local_a4 = vals[9] - *curY;
    }
    CVar4 = cf2_stack_getReal(opStack,top);
    if (local_a4 < local_9c) {
      vals[10] = vals[8] + CVar4;
      vals[0xb] = *curY;
    }
    else {
      vals[10] = *curX;
      vals[0xb] = vals[9] + CVar4;
    }
  }
  for (lastVal = 0; lastVal < 2; lastVal = lastVal + 1) {
    cf2_glyphpath_curveTo
              (glyphPath,vals[(long)(lastVal * 6 + 2) + -2],vals[(long)(lastVal * 6 + 3) + -2],
               vals[(long)(lastVal * 6 + 4) + -2],vals[(long)(lastVal * 6 + 5) + -2],
               vals[(long)(lastVal * 6 + 6) + -2],vals[(long)(lastVal * 6 + 7) + -2]);
  }
  cf2_stack_clear(opStack);
  *curX = vals[10];
  *curY = vals[0xb];
  return;
}

Assistant:

static void
  cf2_doFlex( CF2_Stack       opStack,
              CF2_Fixed*      curX,
              CF2_Fixed*      curY,
              CF2_GlyphPath   glyphPath,
              const FT_Bool*  readFromStack,
              FT_Bool         doConditionalLastRead )
  {
    CF2_Fixed  vals[14];
    CF2_UInt   idx;
    FT_Bool    isHFlex;
    CF2_Int    top, i, j;


    vals[0] = *curX;
    vals[1] = *curY;
    idx     = 0;
    isHFlex = FT_BOOL( readFromStack[9] == FALSE );
    top     = isHFlex ? 9 : 10;

    for ( i = 0; i < top; i++ )
    {
      vals[i + 2] = vals[i];
      if ( readFromStack[i] )
        vals[i + 2] = ADD_INT32( vals[i + 2], cf2_stack_getReal( opStack,
                                                                 idx++ ) );
    }

    if ( isHFlex )
      vals[9 + 2] = *curY;

    if ( doConditionalLastRead )
    {
      FT_Bool    lastIsX = FT_BOOL(
                             cf2_fixedAbs( SUB_INT32( vals[10], *curX ) ) >
                             cf2_fixedAbs( SUB_INT32( vals[11], *curY ) ) );
      CF2_Fixed  lastVal = cf2_stack_getReal( opStack, idx );


      if ( lastIsX )
      {
        vals[12] = ADD_INT32( vals[10], lastVal );
        vals[13] = *curY;
      }
      else
      {
        vals[12] = *curX;
        vals[13] = ADD_INT32( vals[11], lastVal );
      }
    }
    else
    {
      if ( readFromStack[10] )
        vals[12] = ADD_INT32( vals[10],
                              cf2_stack_getReal( opStack, idx++ ) );
      else
        vals[12] = *curX;

      if ( readFromStack[11] )
        vals[13] = ADD_INT32( vals[11],
                              cf2_stack_getReal( opStack, idx ) );
      else
        vals[13] = *curY;
    }

    for ( j = 0; j < 2; j++ )
      cf2_glyphpath_curveTo( glyphPath, vals[j * 6 + 2],
                                        vals[j * 6 + 3],
                                        vals[j * 6 + 4],
                                        vals[j * 6 + 5],
                                        vals[j * 6 + 6],
                                        vals[j * 6 + 7] );

    cf2_stack_clear( opStack );

    *curX = vals[12];
    *curY = vals[13];
  }